

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O1

Vec_Bit_t * Pla_ManPrimesTable(int nVars)

{
  byte bVar1;
  Vec_Bit_t *pVVar2;
  uint *__s;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong __size;
  
  uVar6 = 1 << ((byte)nVars & 0x1f);
  uVar3 = 0x40;
  if (0x40 < (int)uVar6) {
    uVar3 = uVar6;
  }
  iVar8 = ((uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1f) == 0);
  pVVar2 = (Vec_Bit_t *)malloc(0x10);
  pVVar2->nSize = 0;
  iVar7 = iVar8 * 0x20;
  pVVar2->nCap = iVar7;
  __size = (ulong)(uint)(iVar8 * 4);
  __s = (uint *)malloc(__size);
  pVVar2->pArray = (int *)__s;
  pVVar2->nSize = iVar7;
  memset(__s,0xff,__size);
  uVar3 = uVar6;
  if ((int)uVar6 < 0x40) {
    do {
      if ((nVars == 0x1f) || (iVar7 <= (int)uVar3)) goto LAB_0035ce9b;
      bVar1 = (byte)uVar3 & 0x1f;
      __s[uVar3 >> 5] = __s[uVar3 >> 5] & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x40);
  }
  if (iVar7 < (int)uVar6) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                  ,0x1ec,"void Vec_BitShrink(Vec_Bit_t *, int)");
  }
  pVVar2->nSize = uVar6;
  if (nVars != 0x1f) {
    uVar3 = *__s;
    *__s = uVar3 & 0xfffffffe;
    if (1 < (int)uVar6) {
      *__s = uVar3 & 0xfffffffc;
      if (nVars != 1) {
        uVar3 = 3;
        if (3 < (int)uVar6) {
          uVar3 = uVar6;
        }
        uVar5 = 2;
        do {
          uVar4 = uVar5 * 2;
          if ((int)uVar4 < (int)uVar6 && (__s[uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) {
            do {
              bVar1 = (byte)uVar4 & 0x1f;
              __s[uVar4 >> 5] = __s[uVar4 >> 5] & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
              uVar4 = uVar4 + uVar5;
            } while ((int)uVar4 < (int)uVar6);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar3);
      }
      return pVVar2;
    }
  }
LAB_0035ce9b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Generates prime detector for the given bit-widths.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Bit_t * Pla_ManPrimesTable( int nVars )
{
    int i, n, nBits = 1 << nVars;
    Vec_Bit_t * vMap = Vec_BitStartFull( Abc_MaxInt(64, nBits) );
    for ( i = nBits; i < 64; i++ )
        Vec_BitWriteEntry( vMap, i, 0 );
    Vec_BitShrink( vMap, nBits );
    Vec_BitWriteEntry( vMap, 0, 0 );
    Vec_BitWriteEntry( vMap, 1, 0 );
    for ( n = 2; n < nBits; n++ )
        if ( Vec_BitEntry(vMap, n) )
            for ( i = 2*n; i < nBits; i += n )
                Vec_BitWriteEntry( vMap, i, 0 );
    return vMap;
}